

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QTimeZonePrivate::Data_const&>
          (QMovableArrayOps<QTimeZonePrivate::Data> *this,qsizetype i,Data *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  long in_RSI;
  QArrayDataPointer<QTimeZonePrivate::Data> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  Data tmp;
  Data *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar3;
  Inserter *in_stack_ffffffffffffff70;
  GrowthPosition in_stack_ffffffffffffff7c;
  undefined2 in_stack_ffffffffffffff84;
  byte bVar4;
  Inserter local_60;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QTimeZonePrivate::Data>::needsDetach
                    ((QArrayDataPointer<QTimeZonePrivate::Data> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QTimeZonePrivate::Data>::freeSpaceAtEnd(in_RDI), qVar2 != 0)) {
      QArrayDataPointer<QTimeZonePrivate::Data>::end
                ((QArrayDataPointer<QTimeZonePrivate::Data> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      QTimeZonePrivate::Data::Data
                ((Data *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00744419;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QTimeZonePrivate::Data>::freeSpaceAtBegin(in_RDI), qVar2 != 0)) {
      QArrayDataPointer<QTimeZonePrivate::Data>::begin
                ((QArrayDataPointer<QTimeZonePrivate::Data> *)0x7442ba);
      QTimeZonePrivate::Data::Data
                ((Data *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00744419;
    }
  }
  memset(local_38,0xaa,0x30);
  QTimeZonePrivate::Data::Data
            ((Data *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  uVar3 = in_RDI->size != 0 && in_RSI == 0;
  bVar4 = uVar3;
  QArrayDataPointer<QTimeZonePrivate::Data>::detachAndGrow
            ((QArrayDataPointer<QTimeZonePrivate::Data> *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffff84,(uint)(byte)uVar3))),
             in_stack_ffffffffffffff7c,(qsizetype)in_stack_ffffffffffffff70,(Data **)in_RDI,
             (QArrayDataPointer<QTimeZonePrivate::Data> *)CONCAT17(uVar3,in_stack_ffffffffffffff60))
  ;
  if ((bVar4 & 1) == 0) {
    Inserter::Inserter(in_stack_ffffffffffffff70,in_RDI,CONCAT17(uVar3,in_stack_ffffffffffffff60),
                       (qsizetype)in_stack_ffffffffffffff58);
    Inserter::insertOne((Inserter *)CONCAT17(uVar3,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
    Inserter::~Inserter(&local_60);
  }
  else {
    QArrayDataPointer<QTimeZonePrivate::Data>::begin
              ((QArrayDataPointer<QTimeZonePrivate::Data> *)0x744375);
    QTimeZonePrivate::Data::Data
              ((Data *)CONCAT17(uVar3,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QTimeZonePrivate::Data::~Data((Data *)0x744419);
LAB_00744419:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }